

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cirs2gal.cpp
# Opt level: O1

CEExecOptions * DefineOpts(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  CEExecOptions *in_RDI;
  string local_88;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38 [16];
  
  paVar1 = &local_88.field_2;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"cirs2gal","");
  CEExecOptions::CEExecOptions(in_RDI,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  local_40 = 0;
  local_38[0] = 0;
  local_48 = local_38;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_48);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_58 = *plVar3;
    lStack_50 = plVar2[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar3;
    local_68 = (long *)*plVar2;
  }
  local_60 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_68);
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_88.field_2._M_allocated_capacity = *psVar4;
    local_88.field_2._8_8_ = plVar2[3];
    local_88._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_88.field_2._M_allocated_capacity = *psVar4;
    local_88._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_88._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_assign((string *)&(in_RDI->super_CLOptions).program_desc_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68);
  }
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  CEExecOptions::AddCirsPars(in_RDI);
  CEExecOptions::AddJDPar(in_RDI);
  return in_RDI;
}

Assistant:

CEExecOptions DefineOpts()
{
    CEExecOptions opts("cirs2gal");

    // Add a program version and description
    opts.AddProgramDescription(std::string() +
        "Converts from CIRS coordinates to Galactic coordinates for a given " +
        "Julian date.");
        
    // Set the options
    opts.AddCirsPars();
    opts.AddJDPar();
    
    return opts;
}